

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint extraout_EAX;
  long lVar6;
  ulong uVar7;
  int family;
  int family_00;
  int sock;
  int sock_00;
  int family_01;
  int family_02;
  int sock_01;
  int sock_02;
  char *pcVar8;
  char **unaff_R15;
  uchar *buf2;
  uchar *buf1;
  nn_iovec iov;
  nn_msghdr hdr;
  char socket_address_tcp [128];
  char *local_e8;
  char *local_e0;
  char **local_d8;
  undefined8 local_d0;
  undefined8 **local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  char local_a8 [128];
  
  if (argc < 2) {
    pcVar8 = "5555";
  }
  else {
    pcVar8 = argv[1];
  }
  uVar2 = atoi(pcVar8);
  iVar4 = 0x1031cd;
  pcVar8 = "127.0.0.1";
  sprintf(local_a8,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar2);
  iVar3 = test_socket_impl((char *)0x32,iVar4,family,(int)pcVar8);
  iVar4 = iVar3;
  test_bind_impl((char *)0x33,iVar3,0x10310c,pcVar8);
  iVar4 = test_socket_impl((char *)0x34,iVar4,family_00,(int)pcVar8);
  test_connect_impl((char *)0x35,iVar4,0x10310c,pcVar8);
  local_e0 = (char *)nn_allocmsg(0x100,0);
  if (local_e0 == (char *)0x0) goto LAB_00101fb0;
  lVar6 = 0;
  do {
    local_e0[lVar6] = (char)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  unaff_R15 = &local_e0;
  iVar5 = nn_send(iVar4,unaff_R15,0xffffffffffffffff,0);
  if (iVar5 < 0) goto LAB_00101fb5;
  if (iVar5 != 0x100) goto LAB_00101fba;
  local_e8 = (char *)0x0;
  iVar5 = nn_recv(iVar3,&local_e8,0xffffffffffffffff,0);
  if (iVar5 < 0) goto LAB_00101fbf;
  if (iVar5 != 0x100) goto LAB_00101fc4;
  if (local_e8 == (char *)0x0) goto LAB_00101fc9;
  lVar6 = 0;
  do {
    if ((char)lVar6 != local_e8[lVar6]) {
      main_cold_3();
      goto LAB_00101fa6;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  iVar5 = nn_freemsg();
  if (iVar5 != 0) goto LAB_00101fce;
  pcVar8 = (char *)nn_allocmsg(0x100,0);
  local_e0 = pcVar8;
  if (pcVar8 == (char *)0x0) goto LAB_00101fd3;
  lVar6 = 0;
  do {
    pcVar8[lVar6] = (char)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  local_d0 = 0xffffffffffffffff;
  local_b8 = 0;
  uStack_b0 = 0;
  uStack_c0 = 1;
  local_d8 = unaff_R15;
  local_c8 = &local_d8;
  iVar5 = nn_sendmsg(iVar4,&local_c8,0);
  if (iVar5 < 0) goto LAB_00101fd8;
  if (iVar5 != 0x100) goto LAB_00101fdd;
  local_e8 = (char *)0x0;
  local_d0 = 0xffffffffffffffff;
  local_b8 = 0;
  uStack_b0 = 0;
  uStack_c0 = 1;
  local_d8 = &local_e8;
  local_c8 = &local_d8;
  iVar5 = nn_recvmsg(iVar3,&local_c8,0);
  if (iVar5 < 0) goto LAB_00101fe2;
  if (iVar5 != 0x100) goto LAB_00101fe7;
  if (local_e8 == (char *)0x0) goto LAB_00101fec;
  lVar6 = 0;
  do {
    if ((char)lVar6 != local_e8[lVar6]) goto LAB_00101fa6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  iVar5 = nn_freemsg();
  if (iVar5 != 0) goto LAB_00101ff1;
  test_close_impl((char *)0x65,iVar4,sock);
  test_close_impl((char *)0x66,iVar3,sock_00);
  iVar3 = test_socket_impl((char *)0x6a,iVar3,family_01,(int)pcVar8);
  iVar4 = iVar3;
  test_bind_impl((char *)0x6b,iVar3,(int)local_a8,pcVar8);
  iVar4 = test_socket_impl((char *)0x6c,iVar4,family_02,(int)pcVar8);
  test_connect_impl((char *)0x6d,iVar4,(int)local_a8,pcVar8);
  cVar1 = '0';
  uVar7 = 0;
  lVar6 = 0;
  do {
    longdata[lVar6] = cVar1 + (char)(uVar7 / 10) * -10;
    lVar6 = lVar6 + 1;
    cVar1 = cVar1 + '\x01';
    uVar7 = (ulong)((int)uVar7 + 1);
  } while (lVar6 != 0x100000);
  longdata[0xfffff] = '\0';
  unaff_R15 = (char **)strlen(longdata);
  uVar2 = nn_send(iVar3,longdata,unaff_R15,0);
  if (-1 < (int)uVar2) {
    if (uVar2 != (uint)unaff_R15) goto LAB_00102023;
    iVar5 = nn_recv(iVar4,&local_e8,0xffffffffffffffff,0);
    if (iVar5 < 0) goto LAB_00101ff6;
    if (iVar5 != 0xfffff) goto LAB_00101ffb;
    if (local_e8 == (char *)0x0) goto LAB_00102000;
    lVar6 = 0;
    do {
      if ((uint)(byte)local_e8[lVar6] != (int)longdata[lVar6]) goto LAB_00101fab;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0xfffff);
    iVar5 = nn_freemsg();
    if (iVar5 != 0) goto LAB_00102005;
    test_close_impl((char *)0x7d,iVar4,sock_01);
    test_close_impl((char *)0x7e,iVar3,sock_02);
    local_e0 = (char *)nn_allocmsg(8,0);
    if (local_e0 == (char *)0x0) goto LAB_0010200a;
    local_e8 = (char *)nn_reallocmsg(local_e0,1);
    if (local_e8 != local_e0) goto LAB_0010200f;
    local_e0 = (char *)nn_reallocmsg(local_e8,100);
    if (local_e0 == local_e8) goto LAB_00102014;
    if (local_e0 != (char *)0x0) {
      nn_freemsg(local_e0);
      return 0;
    }
    goto LAB_00102019;
  }
  goto LAB_0010201e;
LAB_00101fa6:
  main_cold_7();
LAB_00101fab:
  main_cold_10();
LAB_00101fb0:
  main_cold_26();
LAB_00101fb5:
  main_cold_25();
LAB_00101fba:
  main_cold_1();
LAB_00101fbf:
  main_cold_24();
LAB_00101fc4:
  main_cold_2();
LAB_00101fc9:
  main_cold_23();
LAB_00101fce:
  main_cold_4();
LAB_00101fd3:
  main_cold_22();
LAB_00101fd8:
  main_cold_21();
LAB_00101fdd:
  main_cold_5();
LAB_00101fe2:
  main_cold_20();
LAB_00101fe7:
  main_cold_6();
LAB_00101fec:
  main_cold_19();
LAB_00101ff1:
  main_cold_8();
LAB_00101ff6:
  main_cold_17();
LAB_00101ffb:
  main_cold_9();
LAB_00102000:
  main_cold_16();
LAB_00102005:
  main_cold_11();
LAB_0010200a:
  main_cold_15();
LAB_0010200f:
  main_cold_12();
LAB_00102014:
  main_cold_14();
LAB_00102019:
  main_cold_13();
LAB_0010201e:
  main_cold_18();
  uVar2 = extraout_EAX;
LAB_00102023:
  fprintf(_stderr,"Data to send is truncated: %d != %d (%s:%d)\n",(ulong)uVar2,
          (ulong)unaff_R15 & 0xffffffff,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/msg.c",0x72);
  nn_err_abort();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int sb;
    int sc;
    unsigned char *buf1, *buf2;
    int i;
    struct nn_iovec iov;
    struct nn_msghdr hdr;
    char socket_address_tcp[128];

    test_addr_from(socket_address_tcp, "tcp", "127.0.0.1",
            get_test_port(argc, argv));

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    rc = nn_send (sc, &buf1, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    rc = nn_recv (sb, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    buf1 = nn_allocmsg (256, 0);
    alloc_assert (buf1);
    for (i = 0; i != 256; ++i)
        buf1 [i] = (unsigned char) i;
    iov.iov_base = &buf1;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_sendmsg (sc, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    buf2 = NULL;
    iov.iov_base = &buf2;
    iov.iov_len = NN_MSG;
    memset (&hdr, 0, sizeof (hdr));
    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    nn_assert (buf2);
    for (i = 0; i != 256; ++i)
        nn_assert (buf2 [i] == (unsigned char) i);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);

    /*  Test receiving of large message  */

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, socket_address_tcp);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, socket_address_tcp);

    for (i = 0; i < (int) sizeof (longdata); ++i)
        longdata[i] = '0' + (i % 10);
    longdata [sizeof (longdata) - 1] = 0;
    test_send (sb, longdata);

    rc = nn_recv (sc, &buf2, NN_MSG, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == sizeof (longdata) - 1);
    nn_assert (buf2);
    for (i = 0; i < (int) sizeof (longdata) - 1; ++i)
        nn_assert (buf2 [i] == longdata [i]);
    rc = nn_freemsg (buf2);
    errno_assert (rc == 0);

    test_close (sc);
    test_close (sb);


    /*  Test reallocmsg  */
    buf1 = nn_allocmsg (8, 0);
    alloc_assert (buf1);

    buf2 = nn_reallocmsg (buf1, 1);

    nn_assert (buf2 == buf1);

    buf1 = nn_reallocmsg (buf2, 100);
    nn_assert (buf1 != buf2);
    nn_assert (buf1 != 0);

    nn_freemsg (buf1);

    return 0;
}